

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v_basic.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  int n_col;
  char *__s;
  bool bVar5;
  m256v Msl;
  m2v Mss;
  m2v Bs;
  m256v Mtl;
  m256v Cl;
  uint local_d4;
  m256v local_c0;
  m2v local_a8;
  m2v local_90;
  m256v local_78;
  m2v local_60;
  m256v local_48;
  
  while (iVar4 = getopt(argc,argv,"h"), iVar4 != -1) {
    if (iVar4 == 0x3f) {
      exit(1);
    }
    if (iVar4 == 0x68) {
      usage();
      exit(0);
    }
  }
  puts("Running: test_el_access()");
  _Var2 = test_el_access();
  __s = "--> FAIL (test test_el_access())";
  if (_Var2) {
    __s = "--> pass";
  }
  puts(__s);
  puts("Running: run_mat_pair_test(mptest_el_access2)");
  _Var3 = run_mat_pair_test(mptest_el_access2);
  if (_Var3) {
    local_d4 = (uint)!_Var2;
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_el_access2))");
    local_d4 = 2 - _Var2;
  }
  puts("Running: run_mat_pair_test(mptest_testfuncs)");
  _Var2 = run_mat_pair_test(mptest_testfuncs);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_testfuncs))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_swap_rows)");
  _Var2 = run_mat_pair_test(mptest_swap_rows);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_swap_rows))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_clear_row)");
  _Var2 = run_mat_pair_test(mptest_clear_row);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_clear_row))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_multadd_row)");
  _Var2 = run_mat_pair_test(mptest_multadd_row);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_multadd_row))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_multadd_row_from)");
  _Var2 = run_mat_pair_test(mptest_multadd_row_from);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_multadd_row_from))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_copy_row)");
  _Var2 = run_mat_pair_test(mptest_copy_row);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_copy_row))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_row_iszero)");
  _Var2 = run_mat_pair_test(mptest_row_iszero);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_row_iszero))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_swap_cols)");
  _Var2 = run_mat_pair_test(mptest_swap_cols);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_swap_cols))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_mult_col_from)");
  _Var2 = run_mat_pair_test(mptest_mult_col_from);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_mult_col_from))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_copy_col)");
  _Var2 = run_mat_pair_test(mptest_copy_col);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_copy_col))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_iszero)");
  _Var2 = run_mat_pair_test(mptest_iszero);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_iszero))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_clear)");
  _Var2 = run_mat_pair_test(mptest_clear);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_clear))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: test_copy()");
  bVar1 = false;
  iVar4 = 3;
  do {
    bVar5 = false;
    n_col = 3;
    do {
      get_mat_pair(iVar4,n_col,&local_c0,&local_a8);
      get_mat_pair(iVar4,n_col,&local_78,&local_90);
      clobber_m2v(&local_90);
      m2v_copy(&local_a8,&local_90);
      m256v_copy(&local_c0,&local_78);
      _Var2 = check_mat_pair_equal(&local_78,&local_90);
      free_mat_pair_mem(&local_78,&local_90);
      free_mat_pair_mem(&local_c0,&local_a8);
      if (!_Var2) {
        if (!bVar5) goto LAB_00101644;
        break;
      }
      n_col = ((n_col * 5) / 2) * n_col;
      bVar5 = 0x81 < n_col;
    } while (n_col < 0x82);
    bVar1 = 0x13 < iVar4;
    bVar5 = iVar4 < 0x14;
    iVar4 = (iVar4 * 5) / 2;
  } while (bVar5);
LAB_00101644:
  if (bVar1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_copy())");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_permute_rows)");
  _Var2 = run_mat_pair_test(mptest_permute_rows);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_permute_rows))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: run_mat_pair_test(mptest_permute_cols)");
  _Var2 = run_mat_pair_test(mptest_permute_cols);
  if (_Var2) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test run_mat_pair_test(mptest_permute_cols))");
    local_d4 = local_d4 + 1;
  }
  puts("Running: test_add()");
  bVar1 = false;
  iVar4 = 10;
  do {
    get_mat_pair(iVar4,10,&local_c0,&local_a8);
    get_mat_pair(iVar4,10,&local_78,&local_90);
    get_mat_pair(iVar4,10,&local_48,&local_60);
    clobber_m2v(&local_60);
    m2v_add(&local_a8,&local_90,&local_60);
    m256v_add(&local_c0,&local_78,&local_48);
    _Var2 = check_mat_pair_equal(&local_48,&local_60);
    free_mat_pair_mem(&local_48,&local_60);
    free_mat_pair_mem(&local_78,&local_90);
    free_mat_pair_mem(&local_c0,&local_a8);
    if (!_Var2) break;
    bVar1 = 0x1d < iVar4;
    bVar5 = iVar4 < 0x1e;
    iVar4 = (iVar4 * 0x11) / 10;
  } while (bVar5);
  if (bVar1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_add())");
    local_d4 = local_d4 + 1;
  }
  puts("Running: test_add_inplace()");
  bVar1 = false;
  iVar4 = 7;
  do {
    get_mat_pair(iVar4,7,&local_c0,&local_a8);
    get_mat_pair(iVar4,7,&local_78,&local_90);
    m2v_add_inplace(&local_a8,&local_90);
    m256v_add_inplace(&local_c0,&local_78);
    _Var2 = check_mat_pair_equal(&local_78,&local_90);
    free_mat_pair_mem(&local_78,&local_90);
    free_mat_pair_mem(&local_c0,&local_a8);
    if (!_Var2) break;
    bVar1 = 0x1a < iVar4;
    bVar5 = iVar4 < 0x1b;
    iVar4 = (iVar4 * 0x13) / 10;
  } while (bVar5);
  if (bVar1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_add_inplace())");
    local_d4 = local_d4 + 1;
  }
  puts("Running: test_mul()");
  bVar1 = false;
  iVar4 = 10;
  do {
    get_mat_pair(iVar4,99,&local_c0,&local_a8);
    get_mat_pair(99,10,&local_78,&local_90);
    get_mat_pair(iVar4,10,&local_48,&local_60);
    clobber_m2v(&local_60);
    m2v_mul(&local_a8,&local_90,&local_60);
    m256v_mul(&local_c0,&local_78,&local_48);
    _Var2 = check_mat_pair_equal(&local_48,&local_60);
    free_mat_pair_mem(&local_48,&local_60);
    free_mat_pair_mem(&local_78,&local_90);
    free_mat_pair_mem(&local_c0,&local_a8);
    if (!_Var2) break;
    bVar1 = 0x1d < iVar4;
    bVar5 = iVar4 < 0x1e;
    iVar4 = (iVar4 * 0x11) / 10;
  } while (bVar5);
  if (bVar1) {
    puts("--> pass");
  }
  else {
    puts("--> FAIL (test test_mul())");
    local_d4 = local_d4 + 1;
  }
  return (uint)(local_d4 != 0);
}

Assistant:

int main(int argc, char** argv)
{
	/* Read cmdline args */
	int c;
	while ((c = getopt(argc, argv, "h")) != -1) {
		switch(c) {
		case 'h':
			usage();
			exit(EXIT_SUCCESS);
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	int nfail = 0;
#define RUN_TEST(x) \
	do { \
		printf("Running: " #x "\n"); \
		if (!x) { \
			printf("--> FAIL (test " #x ")\n"); \
			++nfail; \
		} else { \
			printf("--> pass\n"); \
		} \
	} while(0)

	// Tests for the elementary ops on submatrices
	RUN_TEST(test_el_access());
	RUN_TEST(run_mat_pair_test(mptest_el_access2));
	RUN_TEST(run_mat_pair_test(mptest_testfuncs));
	RUN_TEST(run_mat_pair_test(mptest_swap_rows));
	RUN_TEST(run_mat_pair_test(mptest_clear_row));
	RUN_TEST(run_mat_pair_test(mptest_multadd_row));
	RUN_TEST(run_mat_pair_test(mptest_multadd_row_from));
	RUN_TEST(run_mat_pair_test(mptest_copy_row));
	RUN_TEST(run_mat_pair_test(mptest_row_iszero));
	RUN_TEST(run_mat_pair_test(mptest_swap_cols));
	RUN_TEST(run_mat_pair_test(mptest_mult_col_from));
	RUN_TEST(run_mat_pair_test(mptest_copy_col));

	// Tests for the entire matrix
	RUN_TEST(run_mat_pair_test(mptest_iszero));
	RUN_TEST(run_mat_pair_test(mptest_clear));
	RUN_TEST(test_copy());
	RUN_TEST(run_mat_pair_test(mptest_permute_rows));
	RUN_TEST(run_mat_pair_test(mptest_permute_cols));
	RUN_TEST(test_add());
	RUN_TEST(test_add_inplace());
	RUN_TEST(test_mul());
#undef RUN_TEST

	return (nfail == 0 ? EXIT_SUCCESS : EXIT_FAILURE);
}